

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O3

void zscal(int n,complex<double> ca,complex<double> *cx,int incx)

{
  uint uVar1;
  complex<double> *__z;
  ulong uVar2;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  complex<double> local_38;
  
  __z = ca._M_value._0_8_;
  uVar1 = ca._M_value._8_4_;
  if (0 < (int)uVar1 && 0 < n) {
    if (uVar1 == 1) {
      uVar2 = (ulong)(uint)n;
      do {
        local_38._M_value._4_4_ = in_XMM0_Db;
        local_38._M_value._0_4_ = in_XMM0_Da;
        local_38._M_value._8_8_ = in_XMM1_Qa;
        std::complex<double>::operator*=(&local_38,__z);
        *(undefined8 *)__z->_M_value = local_38._M_value._0_8_;
        *(undefined8 *)(__z->_M_value + 8) = local_38._M_value._8_8_;
        __z = __z + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    else {
      uVar2 = (ulong)(uint)n;
      do {
        local_38._M_value._4_4_ = in_XMM0_Db;
        local_38._M_value._0_4_ = in_XMM0_Da;
        local_38._M_value._8_8_ = in_XMM1_Qa;
        std::complex<double>::operator*=(&local_38,__z);
        *(undefined8 *)__z->_M_value = local_38._M_value._0_8_;
        *(undefined8 *)(__z->_M_value + 8) = local_38._M_value._8_8_;
        __z = __z + uVar1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  return;
}

Assistant:

void zscal ( int n, complex <double> ca, complex <double> cx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    ZSCAL scales a complex <double> vector by a complex <double>.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <double> CA, the multiplier.
//
//    Input/output, complex <double> CX[], the vector to be scaled.
//
//    Input, int INCX, the increment between successive entries of CX.
//
{
  int i;

  if ( n <= 0 || incx <= 0 )
  {
    return;
  }

  if ( incx == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i] = ca * cx[i];
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cx[i*incx] = ca * cx[i*incx];
    }
  }
  return;
}